

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python.cc
# Opt level: O0

bool __thiscall flatbuffers::python::Version::IsValid(Version *this)

{
  bool local_19;
  Version *this_local;
  
  if ((((this->major == 0) || (this->major == 2)) || (local_19 = false, this->major == 3)) &&
     (local_19 = false, -1 < this->minor)) {
    local_19 = -1 < this->micro;
  }
  return local_19;
}

Assistant:

bool Version::IsValid() const {
  return (major == 0 || major == 2 || major == 3) && minor >= 0 && micro >= 0;
}